

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O2

void __thiscall NaNNUnit::PrintLog(NaNNUnit *this)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  NaReal NVar7;
  NaReal NVar8;
  
  NaPrintLog("NaNNUnit(this=%p):\n  includes ",this);
  NaNeuralNetDescr::PrintLog(&this->descr);
  NaUnit::PrintLog(&this->super_NaUnit);
  NaPrintLog("  network has the next tunable parameters:\n");
  for (uVar6 = 0; uVar6 <= (this->descr).nHidLayers; uVar6 = uVar6 + 1) {
    lVar5 = (ulong)uVar6 * 0x18;
    plVar1 = (long *)(&this->field_0xf8 + lVar5);
    uVar2 = (**(code **)(*(long *)(&this->field_0xf8 + lVar5) + 0x38))(plVar1);
    uVar3 = (**(code **)(*(long *)(&this->field_0xf8 + lVar5) + 0x30))(plVar1);
    uVar4 = 0;
    NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n",(ulong)uVar6,(ulong)uVar2,(ulong)uVar3);
    while( true ) {
      uVar2 = (**(code **)(*plVar1 + 0x30))(plVar1);
      if (uVar2 <= uVar4) break;
      (**(code **)(*(long *)(&this->field_0x200 + lVar5) + 0x50))(&this->field_0x200 + lVar5,uVar4);
      NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",(ulong)uVar4);
      uVar2 = 0;
      while( true ) {
        uVar3 = (**(code **)(*plVar1 + 0x38))(plVar1);
        if (uVar3 <= uVar2) break;
        (**(code **)(*plVar1 + 0x58))(plVar1,uVar4,uVar2);
        NaPrintLog("\t%+6.3f");
        uVar2 = uVar2 + 1;
      }
      NaPrintLog("\n");
      uVar4 = uVar4 + 1;
    }
  }
  uVar6 = 0;
  NaPrintLog("  defined scale for output layer:\n");
  while( true ) {
    uVar2 = (*(this->super_NaUnit).super_NaLogging._vptr_NaLogging[10])(this);
    if (uVar2 <= uVar6) break;
    NVar7 = NaVector::operator()(&(this->OutputScaler).min,uVar6);
    NVar8 = NaVector::operator()(&(this->OutputScaler).max,uVar6);
    NaPrintLog("    * neuron #%u\tmin=%g\tmax=%g\n",NVar7,SUB84(NVar8,0),(ulong)uVar6);
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void
NaNNUnit::PrintLog () const
{
    unsigned    iLayer, iNeuron, iInput;

    NaPrintLog("NaNNUnit(this=%p):\n  includes ", this);
    descr.PrintLog();
    NaUnit::PrintLog();
    NaPrintLog("  network has the next tunable parameters:\n");

    for(iLayer = InputLayer(); iLayer <= OutputLayer(); ++iLayer){
        NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n", iLayer,
                   weight[iLayer].dim_cols(),
                   weight[iLayer].dim_rows());
        for(iNeuron = 0; iNeuron < weight[iLayer].dim_rows(); ++iNeuron){
            NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",
                       iNeuron, bias[iLayer](iNeuron));
            for(iInput = 0; iInput < weight[iLayer].dim_cols(); ++iInput){
                NaPrintLog("\t%+6.3f", weight[iLayer](iNeuron, iInput));
            }// for inputs of neuron
            NaPrintLog("\n");
        }// for neurons of layer
    }// for layers

    NaPrintLog("  defined scale for output layer:\n");

    for(iNeuron = 0; iNeuron < (unsigned)OutputDim(); ++iNeuron){
        NaPrintLog("    * neuron #%u\tmin=%g\tmax=%g\n", iNeuron,
                   OutputScaler.min(iNeuron), OutputScaler.max(iNeuron));
    }
}